

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

void __thiscall
pfederc::LambdaExpr::LambdaExpr
          (LambdaExpr *this,Lexer *lexer,Position *pos,Exprs *params,
          unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *body)

{
  bool bVar1;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *body_local;
  Exprs *params_local;
  Position *pos_local;
  Lexer *lexer_local;
  LambdaExpr *this_local;
  
  Expr::Expr(&this->super_Expr,lexer,EXPR_LAMBDA,pos);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__LambdaExpr_0017f7e0;
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::vector(&this->params,params);
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::unique_ptr
            (&this->body,body);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->body);
  if (!bVar1) {
    __assert_fail("!!this->body",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                  ,0x129,
                  "pfederc::LambdaExpr::LambdaExpr(const Lexer &, const Position &, Exprs &&, std::unique_ptr<BodyExpr> &&)"
                 );
  }
  _setParents<pfederc::Expr>(&this->params,&this->super_Expr);
  _setParent<pfederc::BodyExpr>(&this->body,&this->super_Expr);
  return;
}

Assistant:

LambdaExpr::LambdaExpr(const Lexer &lexer, const Position &pos,
    Exprs &&params,
    std::unique_ptr<BodyExpr> &&body) noexcept
    : Expr(lexer, ExprType::EXPR_LAMBDA, pos),
      params(std::move(params)), body(std::move(body)) {
  assert(!!this->body);

  _setParents(this->params, this);
  _setParent(this->body, this);
}